

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O0

void __thiscall
duckdb::WindowBoundariesState::WindowBoundariesState
          (WindowBoundariesState *this,BoundWindowExpression *wexpr,idx_t input_size)

{
  ExpressionType EVar1;
  bool bVar2;
  pointer pBVar3;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *pvVar4;
  const_reference pvVar5;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  BoundWindowExpression *in_RSI;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *in_RDI;
  BoundWindowExpression *in_stack_000009c8;
  size_type in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  OrderType OVar6;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *this_00;
  
  this_00 = in_RDI;
  GetWindowBounds(in_stack_000009c8);
  EVar1 = BaseExpression::GetExpressionType((BaseExpression *)in_RSI);
  *(ExpressionType *)
   &in_RDI[2].
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_finish = EVar1;
  this_00[2].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(in_register_00000011,in_DL)
  ;
  *(WindowBoundary *)
   &this_00[3].
    super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>._M_impl.
    super__Vector_impl_data._M_start = in_RSI->start;
  *(WindowBoundary *)
   ((long)&this_00[3].
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start + 1) = in_RSI->end;
  pBVar3 = (pointer)::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            *)&in_RSI->partitions);
  this_00[3].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = pBVar3;
  pBVar3 = (pointer)::std::
                    vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
                    size(&(in_RSI->orders).
                          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        );
  this_00[3].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar3;
  pvVar4 = this_00 + 4;
  bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::empty
                    (this_00);
  if (bVar2) {
    OVar6 = INVALID;
  }
  else {
    pvVar5 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                       ((vector<duckdb::BoundOrderByNode,_true> *)
                        CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8);
    OVar6 = pvVar5->type;
  }
  *(OrderType *)
   &(pvVar4->super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    )._M_impl.super__Vector_impl_data._M_start = OVar6;
  bVar2 = HasPrecedingRange(in_RSI);
  *(bool *)((long)&this_00[4].
                   super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1) = bVar2;
  bVar2 = HasFollowingRange(in_RSI);
  *(bool *)((long)&this_00[4].
                   super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2) = bVar2;
  this_00[4].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[4].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[5].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00[5].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00[5].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00[6].super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FrameBounds::FrameBounds
            ((FrameBounds *)
             &this_00[6].
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  optional_ptr<duckdb::WindowCursor,_true>::optional_ptr
            ((optional_ptr<duckdb::WindowCursor,_true> *)(this_00 + 7));
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::unique_ptr
            ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             0x1a32943);
  return;
}

Assistant:

WindowBoundariesState::WindowBoundariesState(const BoundWindowExpression &wexpr, const idx_t input_size)
    : required(GetWindowBounds(wexpr)), type(wexpr.GetExpressionType()), input_size(input_size),
      start_boundary(wexpr.start), end_boundary(wexpr.end), partition_count(wexpr.partitions.size()),
      order_count(wexpr.orders.size()), range_sense(wexpr.orders.empty() ? OrderType::INVALID : wexpr.orders[0].type),
      has_preceding_range(HasPrecedingRange(wexpr)), has_following_range(HasFollowingRange(wexpr)) {
}